

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O1

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CEseqFloatVisitor::processRightEseqInCBinop
          (CEseqFloatVisitor *this,CBinopExpression *binop,CExpression *left,
          CEseqExpression *rightEseq)

{
  CSeqStatement *pCVar1;
  CMoveStatement *pCVar2;
  bool bVar3;
  TOperationType TVar4;
  CStatement *pCVar5;
  CEseqExpression *pCVar6;
  CBinopExpression *pCVar7;
  CExpression *pCVar8;
  CTempExpression *pCVar9;
  CMemExpression *this_00;
  pointer *__ptr;
  CEseqExpression *in_R8;
  CTemp temp;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_e8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_e0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_d8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_d0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_c8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_c0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_b8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_b0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_a8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_a0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_98;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_90;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_88;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_80;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_78;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_70;
  CSeqStatement *local_68;
  CEseqExpression *local_60;
  CMoveStatement *local_58;
  undefined1 local_50 [32];
  
  pCVar5 = CEseqExpression::getStatement(in_R8);
  bVar3 = isExpCommuteWithStm(&rightEseq->super_CExpression,pCVar5);
  if (bVar3) {
    pCVar6 = (CEseqExpression *)operator_new(0x18);
    pCVar5 = CEseqExpression::getStatement(in_R8);
    (*(pCVar5->super_IStatement).super_INode._vptr_INode[3])(local_50,pCVar5);
    local_98._M_head_impl = (CStatement *)local_50._0_8_;
    local_50._0_8_ = (long *)0x0;
    pCVar7 = (CBinopExpression *)operator_new(0x20);
    (*(rightEseq->super_CExpression).super_IExpression.super_INode._vptr_INode[3])
              (&local_e0,rightEseq);
    local_a0._M_head_impl = local_e0._M_head_impl;
    local_e0._M_head_impl = (CExpression *)0x0;
    pCVar8 = CEseqExpression::getExpression(in_R8);
    (*(pCVar8->super_IExpression).super_INode._vptr_INode[3])(&local_e8,pCVar8);
    local_a8._M_head_impl = local_e8._M_head_impl;
    local_e8._M_head_impl = (CExpression *)0x0;
    TVar4 = CBinopExpression::getOperation((CBinopExpression *)left);
    CBinopExpression::CBinopExpression
              (pCVar7,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_a0,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_a8,TVar4);
    local_70._M_head_impl = (CExpression *)pCVar7;
    CEseqExpression::CEseqExpression
              (pCVar6,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_98,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_70);
    (this->super_IVisitor)._vptr_IVisitor = (_func_int **)pCVar6;
    if ((CBinopExpression *)local_70._M_head_impl != (CBinopExpression *)0x0) {
      (*(((CExpression *)&(local_70._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_70._M_head_impl = (CExpression *)0x0;
    if (local_a8._M_head_impl != (CExpression *)0x0) {
      (*((local_a8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_a8._M_head_impl = (CExpression *)0x0;
    if (local_e8._M_head_impl != (CExpression *)0x0) {
      (*((local_e8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_a0._M_head_impl != (CExpression *)0x0) {
      (*((local_a0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_a0._M_head_impl = (CExpression *)0x0;
    if (local_e0._M_head_impl != (CExpression *)0x0) {
      (*((local_e0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_98._M_head_impl != (CStatement *)0x0) {
      (*((local_98._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_98._M_head_impl = (CStatement *)0x0;
    if ((long *)local_50._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_50._0_8_ + 0x10))();
    }
  }
  else {
    CTemp::CTemp((CTemp *)local_50);
    local_60 = (CEseqExpression *)operator_new(0x18);
    local_68 = (CSeqStatement *)operator_new(0x18);
    local_58 = (CMoveStatement *)operator_new(0x18);
    pCVar9 = (CTempExpression *)operator_new(0x28);
    CTempExpression::CTempExpression(pCVar9,(CTemp *)local_50);
    local_c0._M_head_impl = (CExpression *)pCVar9;
    (*(rightEseq->super_CExpression).super_IExpression.super_INode._vptr_INode[3])
              (&local_e0,rightEseq);
    pCVar2 = local_58;
    local_78._M_head_impl = local_e0._M_head_impl;
    local_e0._M_head_impl = (CExpression *)0x0;
    CMoveStatement::CMoveStatement
              (local_58,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                         *)&local_c0,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_78);
    local_b8._M_head_impl = &pCVar2->super_CStatement;
    pCVar5 = CEseqExpression::getStatement(in_R8);
    (*(pCVar5->super_IStatement).super_INode._vptr_INode[3])(&local_e8,pCVar5);
    pCVar1 = local_68;
    local_80._M_head_impl = (CStatement *)local_e8._M_head_impl;
    local_e8._M_head_impl = (CExpression *)0x0;
    CSeqStatement::CSeqStatement
              (local_68,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)&local_b8,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_80);
    local_b0._M_head_impl = &pCVar1->super_CStatement;
    pCVar7 = (CBinopExpression *)operator_new(0x20);
    this_00 = (CMemExpression *)operator_new(0x10);
    pCVar9 = (CTempExpression *)operator_new(0x28);
    CTempExpression::CTempExpression(pCVar9,(CTemp *)local_50);
    local_90._M_head_impl = (CExpression *)pCVar9;
    CMemExpression::CMemExpression
              (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        *)&local_90);
    local_c8._M_head_impl = (CExpression *)this_00;
    pCVar8 = CEseqExpression::getExpression(in_R8);
    (*(pCVar8->super_IExpression).super_INode._vptr_INode[3])(&local_d8,pCVar8);
    local_d0._M_head_impl = local_d8._M_head_impl;
    local_d8._M_head_impl = (CExpression *)0x0;
    TVar4 = CBinopExpression::getOperation((CBinopExpression *)left);
    CBinopExpression::CBinopExpression
              (pCVar7,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_c8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_d0,TVar4);
    pCVar6 = local_60;
    local_88._M_head_impl = (CExpression *)pCVar7;
    CEseqExpression::CEseqExpression
              (local_60,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)&local_b0,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_88);
    (this->super_IVisitor)._vptr_IVisitor = (_func_int **)pCVar6;
    if ((CBinopExpression *)local_88._M_head_impl != (CBinopExpression *)0x0) {
      (*(((CExpression *)&(local_88._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_88._M_head_impl = (CExpression *)0x0;
    if (local_d0._M_head_impl != (CExpression *)0x0) {
      (*((local_d0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_d0._M_head_impl = (CExpression *)0x0;
    if (local_d8._M_head_impl != (CExpression *)0x0) {
      (*((local_d8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if ((CMemExpression *)local_c8._M_head_impl != (CMemExpression *)0x0) {
      (*(((CExpression *)&(local_c8._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_c8._M_head_impl = (CExpression *)0x0;
    if ((CTempExpression *)local_90._M_head_impl != (CTempExpression *)0x0) {
      (*(((CExpression *)&(local_90._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_90._M_head_impl = (CExpression *)0x0;
    if ((CSeqStatement *)local_b0._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_b0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_b0._M_head_impl = (CStatement *)0x0;
    if ((CExpression *)local_80._M_head_impl != (CExpression *)0x0) {
      (*(((IExpression *)&(local_80._M_head_impl)->super_IStatement)->super_INode)._vptr_INode[2])()
      ;
    }
    local_80._M_head_impl = (CStatement *)0x0;
    if (local_e8._M_head_impl != (CExpression *)0x0) {
      (*((local_e8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if ((CMoveStatement *)local_b8._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_b8._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_b8._M_head_impl = (CStatement *)0x0;
    if (local_78._M_head_impl != (CExpression *)0x0) {
      (*((local_78._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_78._M_head_impl = (CExpression *)0x0;
    if (local_e0._M_head_impl != (CExpression *)0x0) {
      (*((local_e0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if ((CTempExpression *)local_c0._M_head_impl != (CTempExpression *)0x0) {
      (*(((CExpression *)&(local_c0._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_c0._M_head_impl = (CExpression *)0x0;
    if ((CStatement *)local_50._0_8_ != (CStatement *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CExpression> IRT::CEseqFloatVisitor::processRightEseqInCBinop(
        const IRT::CBinopExpression *binop,
        const IRT::CExpression *left, const IRT::CEseqExpression *rightEseq) {

    if (isExpCommuteWithStm(left, rightEseq->getStatement())) {
        return EMOVE_UNIQ(new CEseqExpression(
                std::move(rightEseq->getStatement()->Copy()),
                EMOVE_UNIQ(new CBinopExpression(
                        std::move(left->Copy()),
                        std::move(rightEseq->getExpression()->Copy()),
                        binop->getOperation()
                ))
        ));
    } else {
        CTemp temp;
        return EMOVE_UNIQ(new CEseqExpression(
                SMOVE_UNIQ(new CSeqStatement(
                    SMOVE_UNIQ(new CMoveStatement(
                        EMOVE_UNIQ(new CTempExpression(temp)),
                        std::move(left->Copy())
                    )),
                    std::move(rightEseq->getStatement()->Copy())
                )),
                EMOVE_UNIQ(new CBinopExpression(
                        EMOVE_UNIQ(new CMemExpression( EMOVE_UNIQ(new CTempExpression(temp)))),
                        std::move(rightEseq->getExpression()->Copy()),
                        binop->getOperation()
                ))
        ));
    }
}